

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlNodePtr
xmlCtxtParseContentInternal
          (xmlParserCtxtPtr ctxt,xmlParserInputPtr input,int hasTextDecl,int buildTree)

{
  _xmlNode **pp_Var1;
  int *piVar2;
  int iVar3;
  xmlNodePtr value;
  _xmlNode *p_Var4;
  int *piVar5;
  xmlNodePtr pxVar6;
  xmlChar *pxVar7;
  xmlParserInputPtr pxVar8;
  xmlNodePtr pxVar9;
  
  if (buildTree == 0) {
    value = (xmlNodePtr)0x0;
  }
  else {
    value = xmlNewDocNode(ctxt->myDoc,(xmlNsPtr)0x0,(xmlChar *)"#root",(xmlChar *)0x0);
    if (value == (xmlNodePtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      pxVar9 = (xmlNodePtr)0x0;
      value = (xmlNodePtr)0x0;
      goto LAB_0013fe1a;
    }
  }
  iVar3 = xmlCtxtPushInput(ctxt,input);
  if (iVar3 < 0) {
    pxVar9 = (xmlNodePtr)0x0;
    goto LAB_0013fe1a;
  }
  nameNsPush(ctxt,(xmlChar *)"#root",(xmlChar *)0x0,(xmlChar *)0x0,0,0);
  spacePush(ctxt,-1);
  if (buildTree != 0) {
    nodePush(ctxt,value);
  }
  if (hasTextDecl != 0) {
    xmlDetectEncoding(ctxt);
    pxVar7 = ctxt->input->cur;
    if (((((*pxVar7 == '<') && (pxVar7[1] == '?')) && (pxVar7[2] == 'x')) &&
        ((pxVar7[3] == 'm' && (pxVar7[4] == 'l')))) &&
       (((ulong)pxVar7[5] < 0x21 && ((0x100002600U >> ((ulong)pxVar7[5] & 0x3f) & 1) != 0)))) {
      xmlParseTextDecl(ctxt);
      iVar3 = xmlStrEqual(ctxt->version,"1.0");
      if ((iVar3 != 0) && (iVar3 = xmlStrEqual(ctxt->input->version,"1.0"), iVar3 == 0)) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_VERSION_MISMATCH,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Version mismatch between document and entity\n");
      }
    }
  }
  xmlParseContentInternal(ctxt);
  if (ctxt->input->cur < ctxt->input->end) {
    xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
  }
  if (ctxt->wellFormed == 0) {
    if (ctxt->recovery == 0) goto LAB_0013fd20;
    iVar3 = xmlCtxtIsCatastrophicError(ctxt);
    pxVar9 = (xmlNodePtr)0x0;
    if ((value != (xmlNodePtr)0x0) && (pxVar9 = (xmlNodePtr)0x0, iVar3 == 0)) goto LAB_0013fcfa;
  }
  else {
    if (value != (xmlNodePtr)0x0) {
LAB_0013fcfa:
      pxVar9 = value->children;
      value->children = (_xmlNode *)0x0;
      value->last = (_xmlNode *)0x0;
      p_Var4 = pxVar9;
      if (pxVar9 != (xmlNodePtr)0x0) {
        do {
          p_Var4->parent = (_xmlNode *)0x0;
          pp_Var1 = &p_Var4->next;
          p_Var4 = *pp_Var1;
        } while (*pp_Var1 != (_xmlNode *)0x0);
        goto LAB_0013fd23;
      }
    }
LAB_0013fd20:
    pxVar9 = (xmlNodePtr)0x0;
  }
LAB_0013fd23:
  do {
    ctxt->input->cur = ctxt->input->end;
    xmlParserShrink(ctxt);
    iVar3 = xmlParserGrow(ctxt);
  } while (0 < iVar3);
  if (buildTree != 0) {
    iVar3 = ctxt->nodeNr;
    if (0 < (long)iVar3) {
      ctxt->nodeNr = iVar3 - 1U;
      if (iVar3 == 1) {
        pxVar6 = (xmlNodePtr)0x0;
      }
      else {
        pxVar6 = ctxt->nodeTab[(long)iVar3 + -2];
      }
      ctxt->node = pxVar6;
      ctxt->nodeTab[iVar3 - 1U] = (xmlNodePtr)0x0;
    }
  }
  iVar3 = ctxt->nameNr;
  if (0 < (long)iVar3) {
    ctxt->nameNr = iVar3 - 1U;
    if (iVar3 == 1) {
      pxVar7 = (xmlChar *)0x0;
    }
    else {
      pxVar7 = ctxt->nameTab[(long)iVar3 + -2];
    }
    ctxt->name = pxVar7;
    ctxt->nameTab[iVar3 - 1U] = (xmlChar *)0x0;
  }
  iVar3 = ctxt->spaceNr;
  if (0 < (long)iVar3) {
    ctxt->spaceNr = iVar3 - 1U;
    piVar2 = ctxt->spaceTab;
    piVar5 = piVar2 + (long)iVar3 + -2;
    if (iVar3 == 1) {
      piVar5 = piVar2;
    }
    ctxt->space = piVar5;
    piVar2[iVar3 - 1U] = -1;
  }
  iVar3 = ctxt->inputNr;
  if (0 < (long)iVar3) {
    ctxt->inputNr = iVar3 - 1U;
    if (iVar3 == 1) {
      pxVar8 = (xmlParserInputPtr)0x0;
    }
    else {
      pxVar8 = ctxt->inputTab[(long)iVar3 + -2];
    }
    ctxt->input = pxVar8;
    ctxt->inputTab[iVar3 - 1U] = (xmlParserInputPtr)0x0;
  }
LAB_0013fe1a:
  xmlFreeNode(value);
  return pxVar9;
}

Assistant:

static xmlNodePtr
xmlCtxtParseContentInternal(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                            int hasTextDecl, int buildTree) {
    xmlNodePtr root = NULL;
    xmlNodePtr list = NULL;
    xmlChar *rootName = BAD_CAST "#root";
    int result;

    if (buildTree) {
        root = xmlNewDocNode(ctxt->myDoc, NULL, rootName, NULL);
        if (root == NULL) {
            xmlErrMemory(ctxt);
            goto error;
        }
    }

    if (xmlCtxtPushInput(ctxt, input) < 0)
        goto error;

    nameNsPush(ctxt, rootName, NULL, NULL, 0, 0);
    spacePush(ctxt, -1);

    if (buildTree)
        nodePush(ctxt, root);

    if (hasTextDecl) {
        xmlDetectEncoding(ctxt);

        /*
         * Parse a possible text declaration first
         */
        if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
            (IS_BLANK_CH(NXT(5)))) {
            xmlParseTextDecl(ctxt);
            /*
             * An XML-1.0 document can't reference an entity not XML-1.0
             */
            if ((xmlStrEqual(ctxt->version, BAD_CAST "1.0")) &&
                (!xmlStrEqual(ctxt->input->version, BAD_CAST "1.0"))) {
                xmlFatalErrMsg(ctxt, XML_ERR_VERSION_MISMATCH,
                               "Version mismatch between document and "
                               "entity\n");
            }
        }
    }

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur < ctxt->input->end)
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);

    if ((ctxt->wellFormed) ||
        ((ctxt->recovery) && (!xmlCtxtIsCatastrophicError(ctxt)))) {
        if (root != NULL) {
            xmlNodePtr cur;

            /*
             * Unlink newly created node list.
             */
            list = root->children;
            root->children = NULL;
            root->last = NULL;
            for (cur = list; cur != NULL; cur = cur->next)
                cur->parent = NULL;
        }
    }

    /*
     * Read the rest of the stream in case of errors. We want
     * to account for the whole entity size.
     */
    do {
        ctxt->input->cur = ctxt->input->end;
        xmlParserShrink(ctxt);
        result = xmlParserGrow(ctxt);
    } while (result > 0);

    if (buildTree)
        nodePop(ctxt);

    namePop(ctxt);
    spacePop(ctxt);

    xmlCtxtPopInput(ctxt);

error:
    xmlFreeNode(root);

    return(list);
}